

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O0

int __thiscall chrono::ChArchiveIn::VersionRead<myEmployeeCustomConstructor>(ChArchiveIn *this)

{
  bool bVar1;
  int iVar2;
  mapped_type *pmVar3;
  type_index local_48;
  int local_3c;
  _Node_iterator_base<std::pair<const_std::type_index,_int>,_false> _Stack_38;
  int jv;
  type_index local_30;
  _Node_iterator_base<std::pair<const_std::type_index,_int>,_false> local_28;
  int local_1c;
  ChArchiveIn *pCStack_18;
  int iv;
  ChArchiveIn *this_local;
  
  local_1c = 99999;
  if (((this->super_ChArchive).use_versions & 1U) == 0) {
    this_local._4_4_ = 99999;
  }
  else {
    pCStack_18 = this;
    if (((this->super_ChArchive).cluster_class_versions & 1U) == 0) {
      this_local._4_4_ =
           (*(this->super_ChArchive)._vptr_ChArchive[0x11])
                     (this,&myEmployeeCustomConstructor::typeinfo);
    }
    else {
      std::type_index::type_index(&local_30,(type_info *)&myEmployeeCustomConstructor::typeinfo);
      local_28._M_cur =
           (__node_type *)
           std::
           unordered_map<std::type_index,_int,_std::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_int>_>_>
           ::find(&(this->super_ChArchive).class_versions,&local_30);
      _Stack_38._M_cur =
           (__node_type *)
           std::
           unordered_map<std::type_index,_int,_std::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_int>_>_>
           ::end(&(this->super_ChArchive).class_versions);
      bVar1 = std::__detail::operator==(&local_28,&stack0xffffffffffffffc8);
      if (bVar1) {
        iVar2 = (*(this->super_ChArchive)._vptr_ChArchive[0x11])
                          (this,&myEmployeeCustomConstructor::typeinfo);
        local_3c = iVar2;
        std::type_index::type_index(&local_48,(type_info *)&myEmployeeCustomConstructor::typeinfo);
        pmVar3 = std::
                 unordered_map<std::type_index,_int,_std::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_int>_>_>
                 ::operator[](&(this->super_ChArchive).class_versions,&local_48);
        *pmVar3 = iVar2;
        this_local._4_4_ = local_3c;
      }
      else {
        this_local._4_4_ = local_1c;
      }
    }
  }
  return this_local._4_4_;
}

Assistant:

int VersionRead() {
          int iv = 99999;
          if (!use_versions)
              return iv;
          if (this->cluster_class_versions) {
              if (this->class_versions.find(std::type_index(typeid(T))) == this->class_versions.end()) {
                int jv = this->in_version(typeid(T));
                this->class_versions[std::type_index(typeid(T))] = jv;
                return jv;
              } 
          } 
          else {
              return this->in_version(typeid(T));
          }
          return iv;
      }